

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureHelper::qt_TextureParameterf
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLenum pname
          ,GLfloat param)

{
  undefined4 in_ECX;
  undefined8 in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  TextureBinder binder;
  QOpenGLFunctions *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = (QOpenGLFunctions *)&local_18;
  anon_unknown.dwarf_18e721::TextureBinder::TextureBinder
            ((TextureBinder *)CONCAT44(in_ECX,in_R8D),
             (QOpenGLFunctions *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
             (GLuint)((ulong)this_00 >> 0x20),(GLenum)this_00,(GLenum)((ulong)in_RDI >> 0x20));
  QOpenGLFunctions::glTexParameterf(this_00,(GLenum)((ulong)in_RDI >> 0x20),(GLenum)in_RDI,0.0);
  anon_unknown.dwarf_18e721::TextureBinder::~TextureBinder((TextureBinder *)0x1a75da);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureParameterf(GLuint texture, GLenum target, GLenum bindingTarget, GLenum pname, GLfloat param)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexParameterf(target, pname, param);
}